

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O1

int Ssw_ClassesRefineConst1(Ssw_Cla_t *p,int fRecursive)

{
  uint uVar1;
  int iVar2;
  Aig_Obj_t **ppAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t **ppAVar5;
  int iVar6;
  void **ppvVar7;
  Aig_Man_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  int iVar10;
  Aig_Obj_t *pAVar11;
  Aig_Obj_t *pAVar12;
  long lVar13;
  
  p->vClassNew->nSize = 0;
  pAVar8 = p->pAig;
  pVVar9 = pAVar8->vObjs;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      if (pAVar8->pReprs[lVar13] == pAVar8->pConst1) {
        if (pVVar9 == (Vec_Ptr_t *)0x0) {
          pAVar12 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar12 = (Aig_Obj_t *)pVVar9->pArray[lVar13];
        }
        iVar6 = (*p->pFuncNodeIsConst)(p->pManData,pAVar12);
        if (iVar6 == 0) {
          pVVar9 = p->vClassNew;
          uVar1 = pVVar9->nCap;
          if (pVVar9->nSize == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (pVVar9->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc(0x80);
              }
              else {
                ppvVar7 = (void **)realloc(pVVar9->pArray,0x80);
              }
              pVVar9->pArray = ppvVar7;
              iVar6 = 0x10;
            }
            else {
              iVar6 = uVar1 * 2;
              if (iVar6 <= (int)uVar1) goto LAB_005ddc38;
              if (pVVar9->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar7 = (void **)realloc(pVVar9->pArray,(ulong)uVar1 << 4);
              }
              pVVar9->pArray = ppvVar7;
            }
            pVVar9->nCap = iVar6;
          }
LAB_005ddc38:
          iVar6 = pVVar9->nSize;
          pVVar9->nSize = iVar6 + 1;
          pVVar9->pArray[iVar6] = pAVar12;
        }
      }
      lVar13 = lVar13 + 1;
      pAVar8 = p->pAig;
      pVVar9 = pAVar8->vObjs;
    } while (lVar13 < pVVar9->nSize);
  }
  iVar6 = p->vClassNew->nSize;
  if (iVar6 == 0) {
    iVar6 = 0;
  }
  else if (p->fConstCorr == 0) {
    p->nCands1 = p->nCands1 - iVar6;
    if (iVar6 < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if (pAVar8->pReprs == (Aig_Obj_t **)0x0) {
LAB_005dddd4:
      __assert_fail("p->pReprs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                    ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
    pAVar12 = (Aig_Obj_t *)*p->vClassNew->pArray;
    iVar2 = pAVar12->Id;
    pAVar8->pReprs[iVar2] = (Aig_Obj_t *)0x0;
    lVar13 = (long)p->vClassNew->nSize;
    iVar6 = 1;
    if (lVar13 != 1) {
      ppAVar3 = p->pMemClassesFree;
      pVVar9 = p->vClassNew;
      p->pMemClassesFree = ppAVar3 + lVar13;
      iVar10 = pVVar9->nSize;
      if (0 < iVar10) {
        lVar13 = 0;
        do {
          pAVar4 = (Aig_Obj_t *)pVVar9->pArray[lVar13];
          ppAVar3[lVar13] = pAVar4;
          ppAVar5 = p->pAig->pReprs;
          if (ppAVar5 == (Aig_Obj_t **)0x0) goto LAB_005dddd4;
          pAVar11 = pAVar12;
          if (lVar13 == 0) {
            pAVar11 = (Aig_Obj_t *)0x0;
          }
          ppAVar5[pAVar4->Id] = pAVar11;
          lVar13 = lVar13 + 1;
          pVVar9 = p->vClassNew;
          iVar10 = pVVar9->nSize;
        } while (lVar13 < iVar10);
      }
      if (p->pId2Class[iVar2] != (Aig_Obj_t **)0x0) {
        __assert_fail("p->pId2Class[pRepr->Id] == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                      ,0x5e,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
      }
      if (*ppAVar3 != pAVar12) {
        __assert_fail("pClass[0] == pRepr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                      ,0x5f,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
      }
      p->pId2Class[iVar2] = ppAVar3;
      if (p->pClassSizes[iVar2] != 0) {
        __assert_fail("p->pClassSizes[pRepr->Id] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                      ,0x61,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
      }
      if (iVar10 < 2) {
        __assert_fail("nSize > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                      ,0x62,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
      }
      p->pClassSizes[iVar2] = iVar10;
      p->nClasses = p->nClasses + 1;
      p->nLits = p->nLits + iVar10 + -1;
      if (fRecursive != 0) {
        iVar6 = Ssw_ClassesRefineOneClass(p,pAVar12,1);
        iVar6 = iVar6 + 1;
      }
    }
  }
  else {
    pVVar9 = p->vClassNew;
    iVar6 = 1;
    if (0 < pVVar9->nSize) {
      lVar13 = 0;
      do {
        ppAVar3 = p->pAig->pReprs;
        if (ppAVar3 == (Aig_Obj_t **)0x0) goto LAB_005dddd4;
        ppAVar3[*(int *)((long)pVVar9->pArray[lVar13] + 0x24)] = (Aig_Obj_t *)0x0;
        lVar13 = lVar13 + 1;
        pVVar9 = p->vClassNew;
      } while (lVar13 < pVVar9->nSize);
    }
  }
  return iVar6;
}

Assistant:

int Ssw_ClassesRefineConst1( Ssw_Cla_t * p, int fRecursive )
{
    Aig_Obj_t * pObj, * pReprNew, ** ppClassNew;
    int i;
    // collect the nodes to be refined
    Vec_PtrClear( p->vClassNew );
    for ( i = 0; i < Vec_PtrSize(p->pAig->vObjs); i++ )
        if ( p->pAig->pReprs[i] == Aig_ManConst1(p->pAig) )
        {
            pObj = Aig_ManObj( p->pAig, i );
            if ( !p->pFuncNodeIsConst( p->pManData, pObj ) )
            {
                Vec_PtrPush( p->vClassNew, pObj );
//                Vec_PtrPush( p->vRefined, pObj );
            }
        }
    // check if there is a new class
    if ( Vec_PtrSize(p->vClassNew) == 0 )
        return 0;
    if ( p->fConstCorr )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
            Aig_ObjSetRepr( p->pAig, pObj, NULL );
        return 1;
    }
    p->nCands1 -= Vec_PtrSize(p->vClassNew);
    pReprNew = (Aig_Obj_t *)Vec_PtrEntry( p->vClassNew, 0 );
    Aig_ObjSetRepr( p->pAig, pReprNew, NULL );
    if ( Vec_PtrSize(p->vClassNew) == 1 )
        return 1;
    // create a new class composed of these nodes
    ppClassNew = p->pMemClassesFree;
    p->pMemClassesFree += Vec_PtrSize(p->vClassNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
    {
        ppClassNew[i] = pObj;
        Aig_ObjSetRepr( p->pAig, pObj, i? pReprNew : NULL );
    }
    Ssw_ObjAddClass( p, pReprNew, ppClassNew, Vec_PtrSize(p->vClassNew) );
    // refine them recursively
    if ( fRecursive )
        return 1 + Ssw_ClassesRefineOneClass( p, pReprNew, 1 );
    return 1;
}